

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcRelVoidsElement::IfcRelVoidsElement(IfcRelVoidsElement *this)

{
  *(undefined ***)&this->field_0xc8 = &PTR__Object_0073a1d0;
  *(undefined8 *)&this->field_0xd0 = 0;
  *(char **)&this->field_0xd8 = "IfcRelVoidsElement";
  IfcRelConnects::IfcRelConnects(&this->super_IfcRelConnects,&PTR_construction_vtable_24__007acad0);
  *(undefined8 *)&(this->super_IfcRelConnects).field_0xb0 = 0;
  (this->super_IfcRelConnects).super_IfcRelationship.super_IfcRoot.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>._vptr_ObjectHelper =
       (_func_int **)0x7aca18;
  *(undefined8 *)&this->field_0xc8 = 0x7acab8;
  *(undefined8 *)&(this->super_IfcRelConnects).super_IfcRelationship.super_IfcRoot.field_0x88 =
       0x7aca40;
  *(undefined8 *)&(this->super_IfcRelConnects).super_IfcRelationship.super_IfcRoot.field_0x98 =
       0x7aca68;
  *(undefined8 *)&(this->super_IfcRelConnects).super_IfcRelationship.field_0xa8 = 0x7aca90;
  *(undefined8 *)&(this->super_IfcRelConnects).field_0xb8 = 0;
  (this->RelatedOpeningElement).obj = (LazyObject *)0x0;
  return;
}

Assistant:

IfcRelVoidsElement() : Object("IfcRelVoidsElement") {}